

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

void __thiscall pbrt::SquareMatrix<2>::SquareMatrix(SquareMatrix<2> *this,span<const_float> t)

{
  Float *pFVar1;
  ulong uVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  int va;
  size_t vb;
  
  vb = t.n;
  va = 4;
  if (vb == 4) {
    uVar4 = 0;
    do {
      pFVar1 = t.ptr + uVar4;
      uVar3 = (uint)uVar4;
      uVar2 = uVar4 >> 1;
      uVar4 = uVar4 + 1;
      this->m[uVar2 & 0x7fffffff][uVar3 & 1] = *pFVar1;
    } while (uVar4 != 4);
    return;
  }
  LogFatal<char_const(&)[6],char_const(&)[9],char_const(&)[6],int&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.h"
             ,0x618,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [6])"N * N",
             (char (*) [9])"t.size()",(char (*) [6])"N * N",&va,(char (*) [9])"t.size()",&vb);
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N>::SquareMatrix(pstd::span<const Float> t) {
    CHECK_EQ(N * N, t.size());
    for (int i = 0; i < N * N; ++i)
        m[i / N][i % N] = t[i];
}